

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_symbol_codec.cpp
# Opt level: O1

void __thiscall crnlib::symbol_codec::start_encoding(symbol_codec *this,uint expected_file_size)

{
  this->m_mode = cEncoding;
  this->m_total_model_updates = 0;
  this->m_total_bits_written = 0;
  this->m_bit_buf = 0;
  this->m_bit_count = 0x20;
  if ((this->m_output_buf).m_size != 0) {
    (this->m_output_buf).m_size = 0;
  }
  vector<unsigned_char>::reserve(&this->m_output_buf,expected_file_size);
  if ((this->m_output_syms).m_size != 0) {
    (this->m_output_syms).m_size = 0;
  }
  if ((this->m_arith_output_buf).m_size != 0) {
    (this->m_arith_output_buf).m_size = 0;
  }
  this->m_arith_base = 0;
  this->m_arith_value = 0;
  this->m_arith_length = 0xffffffff;
  this->m_arith_total_bits = 0;
  return;
}

Assistant:

void symbol_codec::start_encoding(uint expected_file_size)
    {
        m_mode = cEncoding;

        m_total_model_updates = 0;
        m_total_bits_written = 0;

        put_bits_init(expected_file_size);

        m_output_syms.resize(0);

        arith_start_encoding();
    }